

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int mz_uncompress(uchar *pDest,mz_ulong *pDest_len,uchar *pSource,mz_ulong source_len)

{
  ulong in_RCX;
  ulong *in_RSI;
  int status;
  mz_stream stream;
  mz_streamp in_stack_ffffffffffffff58;
  int local_a0;
  undefined1 local_98 [8];
  int local_90;
  undefined4 local_78;
  ulong local_70;
  int in_stack_ffffffffffffffa4;
  mz_streamp in_stack_ffffffffffffffa8;
  int local_4;
  
  memset(local_98,0,0x70);
  if ((in_RCX | *in_RSI) < 0x100000000) {
    local_90 = (int)in_RCX;
    local_78 = (undefined4)*in_RSI;
    local_4 = mz_inflateInit((mz_streamp)0x149a64);
    if (local_4 == 0) {
      local_a0 = mz_inflate(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
      if (local_a0 == 1) {
        *in_RSI = local_70;
        local_4 = mz_inflateEnd(in_stack_ffffffffffffff58);
      }
      else {
        mz_inflateEnd(in_stack_ffffffffffffff58);
        if ((local_a0 == -5) && (local_90 == 0)) {
          local_a0 = -3;
        }
        local_4 = local_a0;
      }
    }
  }
  else {
    local_4 = -10000;
  }
  return local_4;
}

Assistant:

int mz_uncompress(unsigned char *pDest, mz_ulong *pDest_len,
                  const unsigned char *pSource, mz_ulong source_len) {
  mz_stream stream;
  int status;
  memset(&stream, 0, sizeof(stream));

  // In case mz_ulong is 64-bits (argh I hate longs).
  if ((source_len | *pDest_len) > 0xFFFFFFFFU) return MZ_PARAM_ERROR;

  stream.next_in = pSource;
  stream.avail_in = (mz_uint32)source_len;
  stream.next_out = pDest;
  stream.avail_out = (mz_uint32)*pDest_len;

  status = mz_inflateInit(&stream);
  if (status != MZ_OK) return status;

  status = mz_inflate(&stream, MZ_FINISH);
  if (status != MZ_STREAM_END) {
    mz_inflateEnd(&stream);
    return ((status == MZ_BUF_ERROR) && (!stream.avail_in)) ? MZ_DATA_ERROR
                                                            : status;
  }
  *pDest_len = stream.total_out;

  return mz_inflateEnd(&stream);
}